

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.hpp
# Opt level: O0

void __thiscall
Commands::command_handler_register_helper::
Register<std::_Bind<void(*(std::_Placeholder<1>,std::_Placeholder<2>,bool))(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,Command_Source*,bool)>>
          (command_handler_register_helper *this,command_info *info,
          _Bind<void_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_bool))(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_Command_Source_*,_bool)>
          *f,int flags)

{
  command_handler_register *this_00;
  function<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_Command_Source_*)>
  local_128;
  command_info local_108;
  command_handler local_a8;
  int local_24;
  _Bind<void_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_bool))(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_Command_Source_*,_bool)>
  *p_Stack_20;
  int flags_local;
  _Bind<void_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_bool))(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_Command_Source_*,_bool)>
  *f_local;
  command_info *info_local;
  command_handler_register_helper *this_local;
  
  this_00 = command_handler_register_instance;
  local_24 = flags;
  p_Stack_20 = f;
  f_local = (_Bind<void_(*(std::_Placeholder<1>,_std::_Placeholder<2>,_bool))(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_Command_Source_*,_bool)>
             *)info;
  info_local = (command_info *)this;
  command_info::command_info(&local_108,info);
  std::
  function<void(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,Command_Source*)>
  ::
  function<std::_Bind<void(*(std::_Placeholder<1>,std::_Placeholder<2>,bool))(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,Command_Source*,bool)>const&,void>
            ((function<void(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,Command_Source*)>
              *)&local_128,p_Stack_20);
  command_handler::command_handler(&local_a8,&local_108,&local_128);
  command_handler_register::Register(this_00,&local_a8,local_24);
  command_handler::~command_handler(&local_a8);
  std::
  function<void_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_Command_Source_*)>
  ::~function(&local_128);
  command_info::~command_info(&local_108);
  return;
}

Assistant:

void Register(command_info info, const F& f, int flags = 0)
		{
			command_handler_register_instance->Register(command_handler(info, std::function<void(const std::vector<std::string>&, Command_Source*)>(f)), flags);
		}